

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O3

int direction_lookup(char *dir)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = str_cmp(dir,"n");
  uVar2 = 0;
  if (bVar1) {
    bVar1 = str_cmp(dir,"north");
    uVar2 = 0;
    if (bVar1) {
      bVar1 = str_cmp(dir,"e");
      uVar2 = 1;
      if (bVar1) {
        bVar1 = str_cmp(dir,"east");
        if (bVar1) {
          bVar1 = str_cmp(dir,"s");
          uVar2 = 2;
          if (bVar1) {
            bVar1 = str_cmp(dir,"south");
            if (bVar1) {
              bVar1 = str_cmp(dir,"w");
              uVar2 = 3;
              if (bVar1) {
                bVar1 = str_cmp(dir,"west");
                if (bVar1) {
                  bVar1 = str_cmp(dir,"u");
                  uVar2 = 4;
                  if (bVar1) {
                    bVar1 = str_cmp(dir,"up");
                    if (bVar1) {
                      bVar1 = str_cmp(dir,"d");
                      uVar2 = 5;
                      if (bVar1) {
                        bVar1 = str_cmp(dir,"down");
                        uVar2 = -(uint)bVar1 | 5;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int direction_lookup(char *dir)
{
	int num;

	if (!str_cmp(dir, "n") || !str_cmp(dir, "north"))
		num = 0;
	else if (!str_cmp(dir, "e") || !str_cmp(dir, "east"))
		num = 1;
	else if (!str_cmp(dir, "s") || !str_cmp(dir, "south"))
		num = 2;
	else if (!str_cmp(dir, "w") || !str_cmp(dir, "west"))
		num = 3;
	else if (!str_cmp(dir, "u") || !str_cmp(dir, "up"))
		num = 4;
	else if (!str_cmp(dir, "d") || !str_cmp(dir, "down"))
		num = 5;
	else
		num = -1;

	return num;
}